

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest_EmptyValue_Test::TestBody(DBTest_EmptyValue_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  DB *pDVar3;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> PVar4;
  undefined8 *puVar5;
  char *pcVar6;
  undefined1 local_99;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 *puStack_90;
  string local_88;
  void *local_68;
  string local_60;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  while( true ) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"key","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"v1","");
    pDVar3 = (this->super_DBTest).db_;
    local_99 = 0;
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_88._M_dataplus._M_p;
    puStack_90 = (undefined8 *)local_88._M_string_length;
    local_40 = local_60._M_dataplus._M_p._0_4_;
    uStack_3c = local_60._M_dataplus._M_p._4_4_;
    uStack_38 = (undefined4)local_60._M_string_length;
    uStack_34 = local_60._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])
              (&local_68,pDVar3,&local_99,
               (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_98,&local_40);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_98,
               (char *)&local_40,(Status *)"Put(\"key\", \"v1\")");
    if (local_68 != (void *)0x0) {
      operator_delete__(local_68);
    }
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    PVar4 = local_98._0_1_;
    if (local_98._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_88);
      pcVar6 = "";
      if (puStack_90 != (undefined8 *)0x0) {
        pcVar6 = (char *)*puStack_90;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x22e,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
      }
    }
    puVar5 = puStack_90;
    if (puStack_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*puStack_90 != puStack_90 + 2) {
        operator_delete((undefined8 *)*puStack_90);
      }
      operator_delete(puVar5);
    }
    if (PVar4 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      return;
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"key","");
    DBTest::Get(&local_88,&this->super_DBTest,&local_60,(Snapshot *)0x0);
    testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
              ((internal *)&local_98,"\"v1\"","Get(\"key\")",(char (*) [3])"v1",&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    PVar4 = local_98._0_1_;
    if (local_98._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_88);
      pcVar6 = "";
      if (puStack_90 != (undefined8 *)0x0) {
        pcVar6 = (char *)*puStack_90;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x22f,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
      }
    }
    puVar5 = puStack_90;
    if (puStack_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*puStack_90 != puStack_90 + 2) {
        operator_delete((undefined8 *)*puStack_90);
      }
      operator_delete(puVar5);
    }
    if (PVar4 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      return;
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"key","");
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
    pDVar3 = (this->super_DBTest).db_;
    local_99 = 0;
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_88._M_dataplus._M_p;
    puStack_90 = (undefined8 *)local_88._M_string_length;
    local_40 = local_60._M_dataplus._M_p._0_4_;
    uStack_3c = local_60._M_dataplus._M_p._4_4_;
    uStack_38 = (undefined4)local_60._M_string_length;
    uStack_34 = local_60._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])
              (&local_68,pDVar3,&local_99,
               (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_98,&local_40);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_98,
               (char *)&local_40,(Status *)"Put(\"key\", \"\")");
    if (local_68 != (void *)0x0) {
      operator_delete__(local_68);
    }
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    PVar4 = local_98._0_1_;
    if (local_98._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_88);
      pcVar6 = "";
      if (puStack_90 != (undefined8 *)0x0) {
        pcVar6 = (char *)*puStack_90;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x230,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
      }
    }
    puVar5 = puStack_90;
    if (puStack_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*puStack_90 != puStack_90 + 2) {
        operator_delete((undefined8 *)*puStack_90);
      }
      operator_delete(puVar5);
    }
    if (PVar4 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      return;
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"key","");
    DBTest::Get(&local_88,&this->super_DBTest,&local_60,(Snapshot *)0x0);
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              ((internal *)&local_98,"\"\"","Get(\"key\")",(char (*) [1])0x185675,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    PVar4 = local_98._0_1_;
    if (local_98._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_88);
      pcVar6 = "";
      if (puStack_90 != (undefined8 *)0x0) {
        pcVar6 = (char *)*puStack_90;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x231,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
      }
    }
    puVar5 = puStack_90;
    if (puStack_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*puStack_90 != puStack_90 + 2) {
        operator_delete((undefined8 *)*puStack_90);
      }
      operator_delete(puVar5);
    }
    if (PVar4 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      return;
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"key","");
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"v2","");
    pDVar3 = (this->super_DBTest).db_;
    local_99 = 0;
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_88._M_dataplus._M_p;
    puStack_90 = (undefined8 *)local_88._M_string_length;
    local_40 = local_60._M_dataplus._M_p._0_4_;
    uStack_3c = local_60._M_dataplus._M_p._4_4_;
    uStack_38 = (undefined4)local_60._M_string_length;
    uStack_34 = local_60._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])
              (&local_68,pDVar3,&local_99,
               (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_98,&local_40);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_98,
               (char *)&local_40,(Status *)"Put(\"key\", \"v2\")");
    if (local_68 != (void *)0x0) {
      operator_delete__(local_68);
    }
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    PVar4 = local_98._0_1_;
    if (local_98._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_88);
      pcVar6 = "";
      if (puStack_90 != (undefined8 *)0x0) {
        pcVar6 = (char *)*puStack_90;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x232,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
      }
    }
    puVar5 = puStack_90;
    if (puStack_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*puStack_90 != puStack_90 + 2) {
        operator_delete((undefined8 *)*puStack_90);
      }
      operator_delete(puVar5);
    }
    if (PVar4 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      return;
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"key","");
    DBTest::Get(&local_88,&this->super_DBTest,&local_60,(Snapshot *)0x0);
    testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
              ((internal *)&local_98,"\"v2\"","Get(\"key\")",(char (*) [3])"v2",&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    PVar4 = local_98._0_1_;
    if (local_98._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_88);
      pcVar6 = "";
      if (puStack_90 != (undefined8 *)0x0) {
        pcVar6 = (char *)*puStack_90;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x233,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
      }
    }
    puVar5 = puStack_90;
    if (puStack_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*puStack_90 != puStack_90 + 2) {
        operator_delete((undefined8 *)*puStack_90);
      }
      operator_delete(puVar5);
    }
    if (PVar4 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) break;
    iVar2 = (this->super_DBTest).option_config_;
    (this->super_DBTest).option_config_ = iVar2 + 1;
    if (2 < iVar2) {
      return;
    }
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
  }
  return;
}

Assistant:

TEST_F(DBTest, EmptyValue) {
  do {
    ASSERT_LEVELDB_OK(Put("key", "v1"));
    ASSERT_EQ("v1", Get("key"));
    ASSERT_LEVELDB_OK(Put("key", ""));
    ASSERT_EQ("", Get("key"));
    ASSERT_LEVELDB_OK(Put("key", "v2"));
    ASSERT_EQ("v2", Get("key"));
  } while (ChangeOptions());
}